

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

double __thiscall cvm::BasicValue::toDouble(BasicValue *this)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  char *pcVar4;
  allocator local_51;
  double local_50;
  char *local_48;
  char *local_40 [2];
  char local_30 [16];
  
  switch(this->Type) {
  case BoolType:
    local_50 = (double)(int)(this->field_2).BoolVal;
    break;
  case IntType:
switchD_00113ac6_caseD_1:
    local_50 = (double)(this->field_2).IntVal;
    break;
  case DoubleType:
    local_50 = (this->field_2).DoubleVal;
    break;
  case StringType:
    std::__cxx11::string::string((string *)local_40,(this->StrVal)._M_dataplus._M_p,&local_51);
    pcVar4 = local_40[0];
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    local_50 = strtod(pcVar4,&local_48);
    if (local_48 == pcVar4) {
      uVar3 = std::__throw_invalid_argument("stod");
      if (*piVar2 == 0) {
        *piVar2 = iVar1;
      }
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
      _Unwind_Resume(uVar3);
    }
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    else if (*piVar2 == 0x22) {
      pcVar4 = "stod";
      std::__throw_out_of_range("stod");
      this = (BasicValue *)pcVar4;
      goto switchD_00113ac6_caseD_1;
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    break;
  default:
    local_50 = 0.0;
  }
  return local_50;
}

Assistant:

double BasicValue::toDouble() const {
  switch (Type) {
  default:          return 0.0;
  case IntType:     return static_cast<double>(IntVal);
  case DoubleType:  return DoubleVal;
  case BoolType:    return static_cast<double>(BoolVal);
  case StringType:  return std::stod(StrVal.c_str());
  }
}